

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metee_linux.c
# Opt level: O1

int TeeGetDeviceHandle(PTEEHANDLE handle)

{
  int iVar1;
  
  if (handle == (PTEEHANDLE)0x0) {
    iVar1 = 4;
  }
  else if (handle->handle == (void *)0x0) {
    iVar1 = -1;
    if (TEE_LOG_LEVEL_ERROR < handle->log_level) {
      if (handle->log_callback == (TeeLogCallback)0x0) {
        __syslog_chk(7,1,"TEELIB: (%s:%s():%d) Internal structure is not initialized\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O1/metee/src/linux/metee_linux.c"
                     ,"TeeGetDeviceHandle",0x1e5);
      }
      else {
        (*handle->log_callback)
                  (false,"TEELIB: (%s:%s():%d) Internal structure is not initialized\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O1/metee/src/linux/metee_linux.c"
                   ,"TeeGetDeviceHandle",0x1e5);
      }
    }
  }
  else {
    iVar1 = *(int *)((long)handle->handle + 0x18);
  }
  return iVar1;
}

Assistant:

TEE_DEVICE_HANDLE TEEAPI TeeGetDeviceHandle(IN PTEEHANDLE handle)
{
	struct mei *me = to_mei(handle);

	if (!handle) {
		return TEE_INVALID_PARAMETER;
	}

	if (!me) {
		DBGPRINT(handle, "Internal structure is not initialized\n");
		return TEE_INVALID_DEVICE_HANDLE;
	}
	
	return me->fd;
}